

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O2

void __thiscall
booster::aio::anon_unknown_15::writer_some::operator()(writer_some *this,error_code *e)

{
  stream_socket *this_00;
  bool bVar1;
  size_t args_1;
  error_code err;
  callback<void_(const_std::error_code_&)> cStack_38;
  intrusive_ptr<booster::aio::(anonymous_namespace)::writer_some> local_30;
  error_code local_28;
  
  if (e->_M_value != 0) {
    callback<void_(const_std::error_code_&,_unsigned_long)>::operator()(&this->h,e,0);
    return;
  }
  local_28._M_value = 0;
  local_28._M_cat = (error_category *)std::_V2::system_category();
  args_1 = stream_socket::write_some(this->sock,&this->buf,&local_28);
  if (((args_1 == 0) && (local_28._M_value != 0)) &&
     (bVar1 = basic_io_device::would_block(&local_28), bVar1)) {
    this_00 = this->sock;
    local_30.p_ = this;
    atomic_counter::inc(&(this->super_callable<void_(const_std::error_code_&)>).super_refcounted.
                         refs_);
    callback<void_(const_std::error_code_&)>::
    callback<booster::aio::(anonymous_namespace)::writer_some>(&cStack_38,&local_30);
    basic_io_device::on_writeable((basic_io_device *)this_00,&cStack_38);
    intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              (&cStack_38.call_ptr);
    intrusive_ptr<booster::aio::(anonymous_namespace)::writer_some>::~intrusive_ptr(&local_30);
    return;
  }
  callback<void_(const_std::error_code_&,_unsigned_long)>::operator()(&this->h,&local_28,args_1);
  return;
}

Assistant:

void operator()(system::error_code const &e) 
		{
			if(e) {
				h(e,0);
			}
			else {
				system::error_code err;
				size_t n=sock->write_some(buf,err);
				if(n==0 && err && basic_io_device::would_block(err))
					sock->on_writeable(pointer(this)); 
				else
					h(err,n);
			}
		}